

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn_lex.cpp
# Opt level: O3

string * __thiscall util::Lexer::ReadOperator_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  ulong in_RAX;
  ulong uVar2;
  size_t sVar3;
  char chars [3];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xff000000ffffffff;
  std::istream::get((char *)this->is);
  uVar2 = std::istream::peek();
  if ((int)uVar2 == -1) {
    uVar2 = uStack_18 >> 0x28 & 0xff;
  }
  else {
    uStack_18._0_6_ = CONCAT15((char)uVar2,(uint5)uStack_18);
  }
  bVar1 = check_op(uStack_18._4_1_,(char)uVar2);
  if (bVar1) {
    std::istream::get((char *)this->is);
  }
  else {
    uStack_18._0_6_ = (uint6)(uint5)uStack_18;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen((char *)((long)&uStack_18 + 4));
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,(char *)((long)&uStack_18 + 4),
             (long)&uStack_18 + sVar3 + 4);
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::ReadOperator()
	{
		char chars[3]{};

		this->GetChar(chars[0]);
		this->PeekChar(chars[1]);

		if (check_op(chars[0], chars[1]))
			this->GetChar(chars[1]);
		else
			chars[1] = '\0';

		return chars;
	}